

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

bool __thiscall QMakeProperty::hasValue(QMakeProperty *this,ProKey *v)

{
  long in_FS_OFFSET;
  ProString local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  value(&local_40,this,v);
  if (&(local_40.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_40.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_40.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_40.m_string.d.ptr != (char16_t *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool
QMakeProperty::hasValue(const ProKey &v)
{
    return !value(v).isNull();
}